

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

List * string_to_list(char *string,char **include_dirs)

{
  int __fd;
  BOOL BVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  FILE *pFVar4;
  List *pLVar5;
  List *pLVar6;
  FILE *pFVar7;
  char filename [32];
  Token t;
  char buf [256];
  char local_158 [32];
  Token local_138;
  char local_118 [264];
  
  if (string_to_list_busy_p == '\x01') {
    __assert_fail("!busy_p",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                  ,0x21c,"List *string_to_list(const char *, const char **)");
  }
  string_to_list_busy_p = 1;
  builtin_strncpy(local_158,"/tmp/syngenXXXXXX",0x12);
  local_158[0x12] = '\0';
  local_158[0x13] = '\0';
  local_158[0x14] = '\0';
  local_158[0x15] = '\0';
  local_158[0x16] = '\0';
  local_158[0x17] = '\0';
  local_158[0x18] = '\0';
  local_158[0x19] = '\0';
  local_158[0x1a] = '\0';
  local_158[0x1b] = '\0';
  local_158[0x1c] = '\0';
  local_158[0x1d] = '\0';
  local_158[0x1e] = '\0';
  local_158[0x1f] = '\0';
  __fd = mkstemp(local_158);
  if (__fd == 0) {
    __stream = (FILE *)0x0;
  }
  else {
    __stream = fdopen(__fd,"w");
  }
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fatal_error("string_to_list: Unable to create temp file!  %s\n",pcVar3);
  }
  fputs(string,__stream);
  fclose(__stream);
  open_file(local_158,(char **)0x0);
  pFVar4 = current_stream();
  BVar1 = fetch_next_token(&local_138);
  if (BVar1 == FALSE) {
    pLVar5 = (List *)0x0;
    fatal_error("Empty expression specified.\n");
  }
  else if (local_138.type == TOK_LEFT_PAREN) {
    pLVar5 = alloc_list();
    pLVar6 = parse_expression();
    pLVar5->car = pLVar6;
    (pLVar5->token).type = TOK_LIST;
    (pLVar5->token).u.string = "[LIST]";
    (pLVar5->token).lineno = 1;
    (pLVar5->token).filename = "<command line>";
    pFVar7 = current_stream();
    if (pFVar7 == pFVar4) {
      close_file();
      pFVar7 = current_stream();
      if (pFVar7 == pFVar4) {
        __assert_fail("current_stream () != temp",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/autc04[P]syn68k/syngen/parse.c"
                      ,0x252,"List *string_to_list(const char *, const char **)");
      }
    }
    unlink(local_158);
    string_to_list_busy_p = 0;
  }
  else {
    pcVar3 = unparse_token(&local_138,local_118);
    pLVar5 = (List *)0x0;
    input_error("Expression must begin with open paren, not \"%s\"\n",pcVar3);
  }
  return pLVar5;
}

Assistant:

List *
string_to_list (const char *string, const char *include_dirs[])
{
  FILE *temp;
  List *enclosing_list;
  Token t;
  char buf[256];
  static int busy_p = FALSE;

  assert (!busy_p);
  busy_p = TRUE;

  /* POOR IMPLEMENTATION - creates temp file to get a FILE * ! */
#if defined(_WIN32)
  char filename[32] = "syngenXXXXXX";
  mktemp(filename);
  temp = fopen(filename, "w");
#else
  char filename[32] = "/tmp/syngenXXXXXX";
  int fd = mkstemp (filename);
  temp = fd ? fdopen (fd, "w") : NULL;
#endif
  if (temp == NULL)
    {
#if !defined (__MINGW32__)
      extern int errno;
      fatal_error ("string_to_list: Unable to create temp file!  %s\n",
		   strerror (errno));
#else
      fatal_error ("string_to_list: Unable to create temp file!\n");
#endif
    }

  fputs (string, temp);
  fclose (temp);
  open_file (filename, NULL);
  temp = current_stream ();

  if (!fetch_next_token (&t))
    {
      fatal_error ("Empty expression specified.\n");
      return NULL;
    }
  if (t.type != TOK_LEFT_PAREN)
    {
      input_error ("Expression must begin with open paren, not \"%s\"\n",
		   unparse_token (&t, buf));
      return NULL;
    }
 
  enclosing_list = alloc_list ();
  enclosing_list->car = parse_expression ();
  enclosing_list->token.type     = TOK_LIST;
  enclosing_list->token.u.string = "[LIST]";
  enclosing_list->token.lineno   = 1;
  enclosing_list->token.filename = "<command line>";

  /* No need to fclose here; that will automatically happen when
   * the parser runs out of tokens for this file.
   */
  if (current_stream () == temp)
    {
      close_file ();
      assert (current_stream () != temp);
    }

  unlink (filename);

  busy_p = FALSE;

  return enclosing_list;
}